

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_backend_test.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tcp_cache_service *this;
  tcp_cache_service *this_00;
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  srv2;
  unique_ptr<cppcms::impl::tcp_cache_service,_std::default_delete<cppcms::impl::tcp_cache_service>_>
  srv1;
  vector<int,_std::allocator<int>_> ports;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ips;
  vector<int,_std::allocator<int>_> local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  intrusive_ptr<cppcms::impl::base_cache> local_148;
  intrusive_ptr<cppcms::impl::base_cache> local_140;
  intrusive_ptr<cppcms::impl::base_cache> local_138;
  intrusive_ptr<cppcms::impl::base_cache> local_130;
  intrusive_ptr<cppcms::impl::base_cache> local_128;
  intrusive_ptr<cppcms::impl::base_cache> local_120;
  intrusive_ptr<cppcms::impl::base_cache> local_118;
  intrusive_ptr<cppcms::impl::base_cache> local_110;
  intrusive_ptr<cppcms::impl::base_cache> local_108;
  intrusive_ptr<cppcms::impl::base_cache> local_100;
  intrusive_ptr<cppcms::impl::base_cache> local_f8;
  intrusive_ptr<cppcms::impl::base_cache> local_f0;
  intrusive_ptr<cppcms::impl::base_cache> local_e8;
  intrusive_ptr<cppcms::impl::base_cache> local_e0;
  intrusive_ptr<cppcms::impl::base_cache> local_d8;
  intrusive_ptr<cppcms::impl::base_cache> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  intrusive_ptr<cppcms::impl::base_cache> local_a8;
  intrusive_ptr<cppcms::impl::base_cache> local_a0;
  intrusive_ptr<cppcms::impl::base_cache> local_98;
  intrusive_ptr<cppcms::impl::base_cache> local_90;
  undefined8 local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing thread cache... ",0x18);
  std::ostream::flush();
  cppcms::impl::thread_cache_factory((uint)&local_d0);
  test_cache(&local_d0,true);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing process cache... ",0x19);
  std::ostream::flush();
  cppcms::impl::process_cache_factory((ulong)&local_d8,0x1000000);
  test_cache(&local_d8,true);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing cache over ip, single server... ",0x28);
  std::ostream::flush();
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"127.0.0.1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p._0_4_ = 0x1771;
  if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_188,
               (iterator)
               local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_c8);
  }
  else {
    *local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0x1771;
    local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  this = (tcp_cache_service *)operator_new(8);
  cppcms::impl::thread_cache_factory((uint)&local_e0);
  local_78 = 0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"127.0.0.1","");
  cppcms::impl::tcp_cache_service::tcp_cache_service(this,&local_e0,&local_78,1,local_40,0x1771,10);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_e0);
  local_90.p_ = (base_cache *)0x0;
  cppcms::impl::tcp_cache_factory(&local_e8,&local_168,&local_188);
  test_cache(&local_e8,false);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_e8);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_90);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing cache over ip, single server with L1 cache... ",0x36);
  std::ostream::flush();
  cppcms::impl::thread_cache_factory((uint)&local_f8);
  cppcms::impl::tcp_cache_factory(&local_f0,&local_168,&local_188,&local_f8);
  test_cache(&local_f0,false);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_f0);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  this_00 = (tcp_cache_service *)operator_new(8);
  cppcms::impl::thread_cache_factory((uint)&local_100);
  local_88 = 0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"127.0.0.1","");
  cppcms::impl::tcp_cache_service::tcp_cache_service
            (this_00,&local_100,&local_88,1,local_60,0x1772,10);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_100);
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"127.0.0.1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p._0_4_ = 0x1772;
  if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_188,
               (iterator)
               local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_c8);
  }
  else {
    *local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0x1772;
    local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing cache over ip, multiple server... ",0x2a);
  std::ostream::flush();
  local_98.p_ = (base_cache *)0x0;
  cppcms::impl::tcp_cache_factory(&local_108,&local_168,&local_188);
  test_cache(&local_108,false);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_108);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_98);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing cache over ip, multiple server with L1 cache... ",0x38);
  std::ostream::flush();
  cppcms::impl::thread_cache_factory((uint)&local_118);
  cppcms::impl::tcp_cache_factory(&local_110,&local_168,&local_188,&local_118);
  test_cache(&local_110,false);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_110);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_118);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&local_168,1);
  std::vector<int,_std::allocator<int>_>::resize(&local_188,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing two clients... ",0x17);
  std::ostream::flush();
  cppcms::impl::thread_cache_factory((uint)&local_128);
  cppcms::impl::tcp_cache_factory(&local_120,&local_168,&local_188,&local_128);
  cppcms::impl::thread_cache_factory((uint)&local_138);
  cppcms::impl::tcp_cache_factory(&local_130,&local_168,&local_188,&local_138);
  test_two_clients(&local_120,&local_130);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_130);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_138);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_120);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_128);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing two clients with L1 cache... ",0x25);
  std::ostream::flush();
  local_a0.p_ = (base_cache *)0x0;
  cppcms::impl::tcp_cache_factory(&local_140,&local_168,&local_188);
  local_a8.p_ = (base_cache *)0x0;
  cppcms::impl::tcp_cache_factory(&local_148,&local_168,&local_188);
  test_two_clients(&local_140,&local_148);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_148);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_a8);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_140);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  cppcms::impl::tcp_cache_service::stop();
  cppcms::impl::tcp_cache_service::stop();
  if (this_00 != (tcp_cache_service *)0x0) {
    cppcms::impl::tcp_cache_service::~tcp_cache_service(this_00);
    operator_delete(this_00);
  }
  if (this != (tcp_cache_service *)0x0) {
    cppcms::impl::tcp_cache_service::~tcp_cache_service(this);
    operator_delete(this);
  }
  return 0;
}

Assistant:

int main()
{
	typedef booster::shared_ptr<cppcms::sessions::session_storage_factory> sfact_type;
	try {
		std::cout << "Testing thread cache... "<< std::flush;
		test_cache(cppcms::impl::thread_cache_factory(20));
		std::cout << "Ok" << std::endl;
		#if !defined(CPPCMS_WIN32) && !defined(CPPCMS_NO_PREFOK_CACHE)
		std::cout << "Testing process cache... " << std::flush;
		test_cache(cppcms::impl::process_cache_factory(16*1024*1024,20));
		std::cout << "Ok" << std::endl;
		#endif
		
		std::unique_ptr<cppcms::impl::tcp_cache_service> srv1,srv2;
		{
			try {
				std::cout << "Testing cache over ip, single server... "<<std::flush;
				std::vector<std::string> ips;
				std::vector<int> ports;
				ips.push_back("127.0.0.1");
				ports.push_back(6001);
				srv1.reset(new cppcms::impl::tcp_cache_service(
							cppcms::impl::thread_cache_factory(20),
							sfact_type(),
							1,"127.0.0.1",6001));

				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,0),false);
				std::cout << "Ok" << std::endl;
				std::cout << "Testing cache over ip, single server with L1 cache... "<<std::flush;
				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)),false);
				std::cout << "Ok" << std::endl;
				srv2.reset(new cppcms::impl::tcp_cache_service(
						cppcms::impl::thread_cache_factory(20),
						sfact_type(),
						1,"127.0.0.1",6002));
				ips.push_back("127.0.0.1");
				ports.push_back(6002);
				std::cout << "Testing cache over ip, multiple server... "<<std::flush;
				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,0),false);
				std::cout << "Ok" << std::endl;
				std::cout << "Testing cache over ip, multiple server with L1 cache... "<<std::flush;
				test_cache(cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)),false);
				std::cout << "Ok" <<std::endl;
				ips.resize(1);
				ports.resize(1);
				std::cout << "Testing two clients... "<<std::flush;
				test_two_clients(
					cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)),
					cppcms::impl::tcp_cache_factory(ips,ports,cppcms::impl::thread_cache_factory(5)));
				std::cout << "Ok" <<std::endl;
				std::cout << "Testing two clients with L1 cache... "<<std::flush;
				test_two_clients(
					cppcms::impl::tcp_cache_factory(ips,ports,0),
					cppcms::impl::tcp_cache_factory(ips,ports,0));
				std::cout << "Ok" <<std::endl;
					
			}
			catch(...) {
				if(srv1.get()) {
					srv1->stop();
					srv1.reset();
				}
				if(srv2.get()) {
					srv2->stop();
					srv2.reset();
				}
				throw;
			}
			srv1->stop();	
			srv2->stop();
			
		}

	}
	catch(std::exception const &e) {
		std::cerr << "\nFail " << e.what() << std::endl;
		return 1;
	}
	return 0;

}